

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O0

void __thiscall QMenuBar::keyPressEvent(QMenuBar *this,QKeyEvent *e)

{
  QAction *pQVar1;
  QAction *pQVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  QFlagsStorage<Qt::KeyboardModifier> __fd;
  Int IVar7;
  QMenuBarPrivate *this_00;
  QStyle *pQVar8;
  QMenu *pQVar9;
  qsizetype qVar10;
  socklen_t *__addr_len;
  QRect *this_01;
  const_reference ppQVar11;
  ulong in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *extraout_RDX_05;
  sockaddr *extraout_RDX_06;
  sockaddr *extraout_RDX_07;
  sockaddr *extraout_RDX_08;
  sockaddr *extraout_RDX_09;
  sockaddr *extraout_RDX_10;
  sockaddr *extraout_RDX_11;
  sockaddr *extraout_RDX_12;
  sockaddr *extraout_RDX_13;
  sockaddr *__addr;
  sockaddr *extraout_RDX_14;
  QMenuBarPrivate *in_RSI;
  QAction *pQVar12;
  ulong in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QAction *next_action;
  qsizetype ampersand;
  int i;
  QAction *firstAfterCurrent;
  QAction *currentSelected;
  QAction *first;
  int clashCount;
  QAction *nextAction;
  int index;
  bool key_consumed;
  int key;
  QMenuBarPrivate *d;
  QString s;
  QAction *act;
  QChar c;
  undefined4 in_stack_fffffffffffffed8;
  CaseSensitivity in_stack_fffffffffffffedc;
  QListSpecialMethodsBase<QAction_*> *in_stack_fffffffffffffee0;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  byte bVar14;
  byte bVar15;
  undefined8 in_stack_fffffffffffffef8;
  QMenuBarPrivate *pQVar16;
  undefined1 b;
  QMenuBarPrivate *in_stack_ffffffffffffff00;
  QMenuBarPrivate *in_stack_ffffffffffffff18;
  undefined2 uVar17;
  QMenuBarPrivate *in_stack_ffffffffffffff20;
  int local_d4;
  QAction *local_d0;
  QAction *local_c8;
  QAction *local_c0;
  int local_b4;
  bool local_95;
  uint uVar18;
  QMenuBarPrivate *this_02;
  undefined4 in_stack_ffffffffffffff88;
  QChar in_stack_ffffffffffffff8c;
  QChar in_stack_ffffffffffffff8e;
  QMenuBarPrivate *in_stack_ffffffffffffffb8;
  char16_t local_32;
  QString local_30;
  undefined4 local_14;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10;
  QFlagsStorage<Qt::KeyboardModifier> local_c;
  long local_8;
  
  b = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RSI;
  this_00 = d_func((QMenuBar *)0x65d3ce);
  __fd.i = (Int)in_RSI;
  QMenuBarPrivate::updateGeometries(in_stack_ffffffffffffffb8);
  uVar5 = QKeyEvent::key((QKeyEvent *)this_02);
  bVar3 = QWidget::isRightToLeft((QWidget *)0x65d401);
  if (bVar3) {
    if (uVar5 == 0x1000012) {
      uVar5 = 0x1000014;
    }
    else if (uVar5 == 0x1000014) {
      uVar5 = 0x1000012;
    }
  }
  if (uVar5 == 0x1000001) {
    uVar5 = 0x1000014;
  }
  else if (uVar5 == 0x1000002) {
    uVar5 = 0x1000012;
  }
  local_95 = false;
  if ((uVar5 == 0x20) || (uVar5 + 0xfefffffc < 2)) {
LAB_0065d4db:
    in_RCX = in_RDI;
    uVar18 = uVar5;
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)
                           );
    __fd.i = 0x12;
    iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x12,0,in_RCX);
    __addr = extraout_RDX_00;
    if ((iVar6 != 0) &&
       (bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65d51c),
       __addr = extraout_RDX_01, bVar3)) {
      QPointer<QAction>::operator->((QPointer<QAction> *)0x65d539);
      pQVar9 = QAction::menu<QMenu*>((QAction *)0x65d541);
      if (pQVar9 == (QMenu *)0x0) {
        if (((uVar18 == 0x1000005) || (uVar18 == 0x1000004)) ||
           (__addr = extraout_RDX_02, uVar18 == 0x20)) {
          pQVar16 = this_00;
          ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x65d5c4);
          QMenuBarPrivate::activateAction
                    (this_00,(QAction *)
                             CONCAT17(in_stack_fffffffffffffeef,
                                      CONCAT16(in_stack_fffffffffffffeee,
                                               CONCAT24(in_stack_fffffffffffffeec,
                                                        in_stack_fffffffffffffee8.i))),
                     (ActionEvent)((ulong)in_stack_fffffffffffffee0 >> 0x20));
          this_00 = pQVar16;
          ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x65d5f4);
          b = (undefined1)((ulong)pQVar16 >> 0x38);
          in_RCX = 0;
          QMenuBarPrivate::setCurrentAction
                    (in_stack_ffffffffffffff20,
                     (QAction *)
                     CONCAT26(in_stack_ffffffffffffff8e.ucs,
                              CONCAT24(in_stack_ffffffffffffff8c.ucs,in_stack_ffffffffffffff88)),
                     SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffff18 >> 0x30,0));
          __fd.i = 0;
          QMenuBarPrivate::setKeyboardMode(in_stack_ffffffffffffff00,(bool)b);
          __addr = extraout_RDX_04;
        }
      }
      else {
        pQVar16 = this_00;
        pQVar12 = ::QPointer::operator_cast_to_QAction_((QPointer<QAction> *)0x65d568);
        __fd.i = (Int)pQVar12;
        QMenuBarPrivate::popupAction(this_02,(QAction *)pQVar16,SUB41(uVar18 >> 0x18,0));
        __addr = extraout_RDX_03;
        in_stack_ffffffffffffff00 = this_00;
        this_00 = pQVar16;
      }
      local_95 = true;
    }
  }
  else if (uVar5 == 0x1000012) {
LAB_0065d623:
    uVar18 = uVar5;
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65d637);
    __addr = extraout_RDX_05;
    if (bVar3) {
      qVar10 = QListSpecialMethodsBase<QAction*>::indexOf<QPointer<QAction>>
                         (in_stack_fffffffffffffee0,
                          (QPointer<QAction> *)
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),0x65d667);
      __fd.i = (Int)qVar10;
      in_RCX = (ulong)uVar18;
      pQVar12 = QMenuBarPrivate::getNextAction
                          (in_stack_ffffffffffffff18,(int)(in_RDI >> 0x20),(int)in_RDI);
      local_95 = pQVar12 != (QAction *)0x0;
      __addr = extraout_RDX_06;
      if (local_95) {
        __fd.i = (Int)pQVar12;
        in_RCX = 0;
        QMenuBarPrivate::setCurrentAction
                  (in_stack_ffffffffffffff20,
                   (QAction *)
                   CONCAT26(in_stack_ffffffffffffff8e.ucs,
                            CONCAT24(in_stack_ffffffffffffff8c.ucs,in_stack_ffffffffffffff88)),
                   SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffff18 >> 0x30,0));
        __addr = extraout_RDX_07;
      }
    }
  }
  else {
    if (uVar5 == 0x1000013) goto LAB_0065d4db;
    if (uVar5 == 0x1000014) goto LAB_0065d623;
    if (uVar5 == 0x1000015) goto LAB_0065d4db;
    local_95 = false;
    __addr = extraout_RDX;
  }
  uVar17 = (undefined2)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  if (local_95 == false) {
    __fd.i = 0x46;
    auVar13 = QKeyEvent::matches((StandardKey)this_02);
    __addr = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      in_RCX = 0;
      QMenuBarPrivate::setCurrentAction
                (in_stack_ffffffffffffff20,
                 (QAction *)
                 CONCAT26(in_stack_ffffffffffffff8e.ucs,
                          CONCAT24(in_stack_ffffffffffffff8c.ucs,in_stack_ffffffffffffff88)),
                 SUB21((ushort)uVar17 >> 8,0),SUB21(uVar17,0));
      __fd.i = 0;
      QMenuBarPrivate::setKeyboardMode(in_stack_ffffffffffffff00,(bool)b);
      local_95 = true;
      __addr = extraout_RDX_08;
    }
  }
  __addr_len = (socklen_t *)CONCAT71((int7)(in_RCX >> 8),local_95);
  bVar3 = false;
  bVar14 = 0;
  if (local_95 == false) {
    local_c.i = QKeyEvent::modifiers();
    bVar4 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
    if (!bVar4) {
      local_14 = QKeyEvent::modifiers();
      __fd.i = (Int)Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                  (enum_type)in_stack_fffffffffffffee0);
      local_10.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)in_stack_fffffffffffffee0,
                      (QFlags<Qt::KeyboardModifier>)in_stack_fffffffffffffee8.i);
      IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
      __addr_len = (socklen_t *)(ulong)IVar7;
      bVar14 = 0;
      __addr = extraout_RDX_09;
      if (IVar7 == 0) goto LAB_0065d838;
    }
    __fd.i = (Int)this_02;
    QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    bVar3 = true;
    __addr_len = (socklen_t *)QString::size(&local_30);
    bVar14 = 0;
    __addr = extraout_RDX_10;
    if (__addr_len == (socklen_t *)0x1) {
      bVar14 = (this_00->field_0x2a0 & 1) != 0 ^ 0xff;
    }
  }
LAB_0065d838:
  bVar15 = bVar14;
  if (bVar3) {
    QString::~QString((QString *)0x65d856);
    __addr = extraout_RDX_11;
  }
  if ((bVar14 & 1) != 0) {
    local_b4 = 0;
    local_c0 = (QAction *)0x0;
    local_c8 = (QAction *)0x0;
    local_d0 = (QAction *)0x0;
    local_32 = 0xaaaa;
    QKeyEvent::text((QKeyEvent *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    pQVar12 = (QAction *)0x0;
    QString::at((QString *)
                CONCAT17(bVar15,CONCAT16(bVar14,CONCAT24(in_stack_fffffffffffffeec,
                                                         in_stack_fffffffffffffee8.i))),
                (qsizetype)in_stack_fffffffffffffee0);
    local_32 = (char16_t)QChar::toUpper((QChar *)in_stack_fffffffffffffee0);
    QString::~QString((QString *)0x65d8e5);
    local_d4 = 0;
    while( true ) {
      __fd.i = (Int)pQVar12;
      this_01 = (QRect *)(long)local_d4;
      __addr_len = (socklen_t *)QList<QAction_*>::size(&(this_00->super_QWidgetPrivate).actions);
      if ((long)__addr_len <= (long)this_01) break;
      pQVar12 = (QAction *)(long)local_d4;
      QList<QRect>::at((QList<QRect> *)this_01,
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      bVar3 = QRect::isNull(this_01);
      if (!bVar3) {
        ppQVar11 = QList<QAction_*>::at
                             ((QList<QAction_*> *)this_01,
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        pQVar1 = *ppQVar11;
        pQVar12 = pQVar1;
        QAction::text();
        bVar3 = QString::isEmpty((QString *)0x65d9bb);
        pQVar2 = local_c8;
        if (!bVar3) {
          QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff8e,L'&');
          pQVar12 = (QAction *)(ulong)(ushort)in_stack_ffffffffffffff8e.ucs;
          in_stack_ffffffffffffff20 =
               (QMenuBarPrivate *)
               QString::indexOf((QString *)
                                CONCAT17(bVar15,CONCAT16(bVar14,CONCAT24(in_stack_fffffffffffffeec,
                                                                         in_stack_fffffffffffffee8.i
                                                                        ))),
                                (QChar)(char16_t)(uVar5 >> 0x10),(qsizetype)this_01,
                                in_stack_fffffffffffffedc);
          if (-1 < (long)in_stack_ffffffffffffff20) {
            QString::operator[]((QString *)
                                CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                0x65da1a);
            in_stack_ffffffffffffff8c = QChar::toUpper((QChar *)this_01);
            pQVar12 = (QAction *)&local_32;
            bVar3 = ::operator==((QChar *)this_01,
                                 (QChar *)CONCAT44(in_stack_fffffffffffffedc,
                                                   in_stack_fffffffffffffed8));
            if (bVar3) {
              local_b4 = local_b4 + 1;
              if (local_c0 == (QAction *)0x0) {
                local_c0 = pQVar1;
              }
              pQVar12 = (QAction *)&this_00->currentAction;
              bVar3 = ::operator==((QAction **)this_01,
                                   (QPointer<QAction> *)
                                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              pQVar2 = pQVar1;
              if (((!bVar3) && (pQVar2 = local_c8, local_d0 == (QAction *)0x0)) &&
                 (local_c8 != (QAction *)0x0)) {
                local_d0 = pQVar1;
              }
            }
          }
        }
        local_c8 = pQVar2;
        QString::~QString((QString *)0x65dac8);
      }
      local_d4 = local_d4 + 1;
    }
    __addr = extraout_RDX_12;
    pQVar12 = (QAction *)0x0;
    if (((0 < local_b4) && (pQVar12 = local_c0, local_b4 != 1)) &&
       ((bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x65db03),
        __addr = extraout_RDX_13, bVar3 &&
        ((local_c8 == (QAction *)0x0 || (local_d0 != (QAction *)0x0)))))) {
      pQVar12 = local_d0;
    }
    if (pQVar12 != (QAction *)0x0) {
      local_95 = true;
      __fd.i = (Int)pQVar12;
      __addr_len = (socklen_t *)0x1;
      QMenuBarPrivate::setCurrentAction
                (in_stack_ffffffffffffff20,
                 (QAction *)
                 CONCAT26(in_stack_ffffffffffffff8e.ucs,
                          CONCAT24(in_stack_ffffffffffffff8c.ucs,in_stack_ffffffffffffff88)),
                 SUB81((ulong)pQVar12 >> 0x38,0),SUB81((ulong)pQVar12 >> 0x30,0));
      __addr = extraout_RDX_14;
    }
  }
  if (local_95 == false) {
    QEvent::ignore((QEvent *)this_02);
  }
  else {
    QEvent::accept((QEvent *)this_02,__fd.i,__addr,__addr_len);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBar::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenuBar);
    d->updateGeometries();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
    if (key == Qt::Key_Tab) //means right
        key = Qt::Key_Right;
    else if (key == Qt::Key_Backtab) //means left
        key = Qt::Key_Left;

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Up:
    case Qt::Key_Down:
    case Qt::Key_Enter:
    case Qt::Key_Space:
    case Qt::Key_Return: {
        if (!style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this) || !d->currentAction)
           break;
        if (d->currentAction->menu()) {
            d->popupAction(d->currentAction, true);
        } else if (key == Qt::Key_Enter || key == Qt::Key_Return || key == Qt::Key_Space) {
            d->activateAction(d->currentAction, QAction::Trigger);
            d->setCurrentAction(d->currentAction, false);
            d->setKeyboardMode(false);
        }
        key_consumed = true;
        break; }

    case Qt::Key_Right:
    case Qt::Key_Left: {
        if (d->currentAction) {
            int index = d->actions.indexOf(d->currentAction);
            if (QAction *nextAction = d->getNextAction(index, key == Qt::Key_Left ? -1 : +1)) {
                d->setCurrentAction(nextAction, d->popupState, true);
                key_consumed = true;
            }
        }
        break; }

    default:
        key_consumed = false;
    }

#ifndef QT_NO_SHORTCUT
    if (!key_consumed && e->matches(QKeySequence::Cancel)) {
        d->setCurrentAction(nullptr);
        d->setKeyboardMode(false);
        key_consumed = true;
    }
#endif

    if (!key_consumed &&
       (!e->modifiers() ||
        (e->modifiers()&(Qt::MetaModifier|Qt::AltModifier))) && e->text().size()==1 && !d->popupState) {
        int clashCount = 0;
        QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
        {
            const QChar c = e->text().at(0).toUpper();
            for(int i = 0; i < d->actions.size(); ++i) {
                if (d->actionRects.at(i).isNull())
                    continue;
                QAction *act = d->actions.at(i);
                QString s = act->text();
                if (!s.isEmpty()) {
                    qsizetype ampersand = s.indexOf(u'&');
                    if (ampersand >= 0) {
                        if (s[ampersand+1].toUpper() == c) {
                            clashCount++;
                            if (!first)
                                first = act;
                            if (act == d->currentAction)
                                currentSelected = act;
                            else if (!firstAfterCurrent && currentSelected)
                                firstAfterCurrent = act;
                        }
                    }
                }
            }
        }
        QAction *next_action = nullptr;
        if (clashCount >= 1) {
            if (clashCount == 1 || !d->currentAction || (currentSelected && !firstAfterCurrent))
                next_action = first;
            else
                next_action = firstAfterCurrent;
        }
        if (next_action) {
            key_consumed = true;
            d->setCurrentAction(next_action, true, true);
        }
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}